

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O3

void __thiscall SMC::geometryinfo(SMC *this,string *fname)

{
  double dVar1;
  pointer pbVar2;
  double (*paadVar3) [37] [37];
  char cVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  string line;
  ifstream input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260;
  double (*local_240) [37] [37];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(fname->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
    local_240 = this->MtorsionEEdis;
    iVar5 = 0;
    iVar8 = -1;
    do {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      local_260._M_string_length = 0;
      local_260.field_2._M_local_buf[0] = '\0';
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_260,cVar4);
      if (*local_260._M_dataplus._M_p != '#') {
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        split(&local_260,' ',&local_278);
        paadVar3 = local_240;
        pbVar2 = local_278.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)local_278.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_278.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (lVar6 == 1) {
          iVar7 = iVar8 + 1;
          dVar1 = atof(((local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
          this->EEdisBy[(long)iVar8 + 1] = dVar1;
          iVar5 = 0;
        }
        else {
          iVar7 = iVar8;
          if (lVar6 == 0x25) {
            lVar6 = 0;
            do {
              dVar1 = atof(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar6 * 4));
              *(double *)((long)paadVar3[iVar8][iVar5] + lVar6) = dVar1;
              lVar6 = lVar6 + 8;
            } while (lVar6 != 0x128);
            iVar5 = iVar5 + 1;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_278);
        iVar8 = iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void SMC::geometryinfo(string fname) {
    // Populate etedP collection of distance lengths
    // Conditional distribution
    ifstream input(fname.c_str());
    int Countset = 0, FraglenCount = -1;
    while (!input.eof()) {
        // Read line
        string line;
        getline(input, line);
        if (line[0] == '#') continue;

        // Tokenize by tabs
        vector<string> token;
        split(line, ' ', token);
        if (token.size() == 1) {
            FraglenCount++;
            Countset = 0;
            EEdisBy[FraglenCount] = atof(token[0].c_str());
        }
        else if (token.size() == 37) {
            for (int i = 0; i < 37; i++) {
                MtorsionEEdis[FraglenCount][Countset][i] = atof(token[i].c_str());
            }
            Countset++;

        }
    }
}